

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O3

void __thiscall
RenX_LoggingPlugin::RenX_OnJoin(RenX_LoggingPlugin *this,Server *server,PlayerInfo *player)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if ((this->field_0xa0 & 8) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_40,&this->joinPublicFmt);
    if (local_40._M_string_length != 0) {
      RenX::processTags((string *)&local_40,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
      RenX::Server::sendPubChan(server,local_40._M_string_length,local_40._M_dataplus._M_p);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_40,&this->joinAdminFmt + (player->steamid == 0));
  if (local_40._M_string_length != 0) {
    cVar2 = RenX::Server::isMatchPending();
    if (cVar2 == '\0') {
      RenX::processTags((string *)&local_40,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
      RenX::Server::sendAdmChan(server,local_40._M_string_length,local_40._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player)
{
	std::string msg;
	if (RenX_LoggingPlugin::joinPublic)
	{
		msg = this->joinPublicFmt;
		if (!msg.empty())
		{
			RenX::processTags(msg, &server, &player);
			server.sendPubChan(msg);
		}
	}
	if (player.steamid == 0)
		msg = this->joinNoSteamAdminFmt;
	else
		msg = this->joinAdminFmt;

	if (!msg.empty() && server.isMatchPending() == false)
	{
		RenX::processTags(msg, &server, &player);
		server.sendAdmChan(msg);
	}
}